

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

void __thiscall
nonius::junit_reporter::do_analysis_complete
          (junit_reporter *this,
          sample_analysis<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *analysis)

{
  result *in_RDI;
  result *in_stack_ffffffffffffff48;
  exception_ptr local_18 [3];
  
  sample_analysis<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>::sample_analysis
            (&in_RDI->analysis,&in_stack_ffffffffffffff48->analysis);
  std::__exception_ptr::exception_ptr::exception_ptr(local_18,(nullptr_t)0x0);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>_>_>
  ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>_>_>
                *)in_RDI,(key_type *)in_stack_ffffffffffffff48);
  result::operator=(in_RDI,in_stack_ffffffffffffff48);
  result::~result(in_RDI);
  return;
}

Assistant:

void do_analysis_complete(sample_analysis<fp_seconds> const& analysis) override {
            data[current] = { analysis, nullptr };
        }